

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
vkt::shaderexecutor::
Apply<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>::
doEvaluate(IVal *__return_storage_ptr__,
          Apply<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>
          *this,EvalContext *ctx)

{
  Func<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>
  *this_00;
  Expr<bool> *this_01;
  Expr<float> *pEVar1;
  Expr<vkt::shaderexecutor::Void> *this_02;
  IArg3 local_61;
  IVal local_60;
  IVal local_48;
  IVal local_30;
  EvalContext *local_18;
  EvalContext *ctx_local;
  Apply<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  this_00 = this->m_func;
  local_18 = ctx;
  ctx_local = (EvalContext *)this;
  this_01 = de::SharedPtr<const_vkt::shaderexecutor::Expr<bool>_>::operator->
                      ((SharedPtr<const_vkt::shaderexecutor::Expr<bool>_> *)&this->m_args);
  Expr<bool>::evaluate(&local_30,this_01,local_18);
  pEVar1 = de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator->
                     ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&(this->m_args).b);
  Expr<float>::evaluate(&local_48,pEVar1,local_18);
  pEVar1 = de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator->
                     ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&(this->m_args).c);
  Expr<float>::evaluate(&local_60,pEVar1,local_18);
  this_02 = de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::operator->
                      ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)
                       &(this->m_args).d);
  Expr<vkt::shaderexecutor::Void>::evaluate(this_02,local_18);
  Func<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>::apply
            (__return_storage_ptr__,this_00,ctx,&local_30,&local_48,&local_60,&local_61);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}